

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-condvar.c
# Opt level: O1

void worker_config_init(worker_config_conflict *wc,int use_broadcast,signal_func signal_f,
                       wait_func wait_f)

{
  int iVar1;
  long *plVar2;
  int64_t eval_b;
  int64_t eval_a;
  long local_28;
  
  memset(wc,0,0xb8);
  wc->signal_cond = signal_f;
  wc->wait_cond = wait_f;
  wc->use_broadcast = use_broadcast;
  iVar1 = uv_sem_init(wc,0);
  local_28 = (long)iVar1;
  if (local_28 == 0) {
    iVar1 = uv_sem_init(&wc->sem_signaled,0);
    local_28 = (long)iVar1;
    if (local_28 != 0) goto LAB_0018386d;
    iVar1 = uv_cond_init(&wc->cond);
    local_28 = (long)iVar1;
    if (local_28 == 0) {
      iVar1 = uv_mutex_init(&wc->mutex);
      local_28 = (long)iVar1;
      if (local_28 == 0) {
        return;
      }
      goto LAB_0018388b;
    }
  }
  else {
    worker_config_init_cold_1();
LAB_0018386d:
    worker_config_init_cold_2();
  }
  worker_config_init_cold_3();
LAB_0018388b:
  plVar2 = &local_28;
  worker_config_init_cold_4();
  uv_mutex_destroy(plVar2 + 8);
  uv_cond_destroy(plVar2 + 0xd);
  uv_sem_destroy(plVar2 + 4);
  uv_sem_destroy(plVar2);
  return;
}

Assistant:

void worker_config_init(worker_config* wc,
                        int use_broadcast,
                        signal_func signal_f,
                        wait_func wait_f) {
  /* Wipe. */
  memset(wc, 0, sizeof(*wc));

  /* Copy vars. */
  wc->signal_cond = signal_f;
  wc->wait_cond = wait_f;
  wc->use_broadcast = use_broadcast;

  /* Init. */
  ASSERT_OK(uv_sem_init(&wc->sem_waiting, 0));
  ASSERT_OK(uv_sem_init(&wc->sem_signaled, 0));
  ASSERT_OK(uv_cond_init(&wc->cond));
  ASSERT_OK(uv_mutex_init(&wc->mutex));
}